

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int standardize_path(char *fullpath,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char local_838 [8];
  char cwd [1025];
  char local_428 [8];
  char tmpPath [1025];
  int *status_local;
  char *fullpath_local;
  
  unique0x10000123 = status;
  iVar1 = fits_path2url(fullpath,0x401,local_428,status);
  if (iVar1 == 0) {
    if (local_428[0] != '/') {
      fits_get_cwd(local_838,stack0xffffffffffffffe0);
      sVar2 = strlen(local_838);
      sVar3 = strlen(local_428);
      if (0x400 < sVar2 + sVar3 + 1) {
        ffpmsg("Tile name is too long. (standardize_path)");
        *stack0xffffffffffffffe0 = 0x68;
        return 0x68;
      }
      strcat(local_838,"/");
      strcat(local_838,local_428);
      fits_clean_url(local_838,local_428,stack0xffffffffffffffe0);
    }
    strcpy(fullpath,local_428);
    fullpath_local._4_4_ = *stack0xffffffffffffffe0;
  }
  else {
    fullpath_local._4_4_ = *stack0xffffffffffffffe0;
  }
  return fullpath_local._4_4_;
}

Assistant:

int standardize_path(char *fullpath, int* status)
{
   /* Utility function for common operation in fits_already_open 
      fullpath:  I/O string to be standardized. Assume len = FLEN_FILENAME */
    
   char tmpPath[FLEN_FILENAME];
   char cwd [FLEN_FILENAME];
    
   if (fits_path2url(fullpath, FLEN_FILENAME, tmpPath, status))
      return(*status);
   
   if (tmpPath[0] != '/')
   {
      fits_get_cwd(cwd,status);
      if (strlen(cwd) + strlen(tmpPath) + 1 > FLEN_FILENAME-1) {
	    ffpmsg("Tile name is too long. (standardize_path)");
            return(*status = FILE_NOT_OPENED);
      }
      strcat(cwd,"/");
      strcat(cwd,tmpPath);
      fits_clean_url(cwd,tmpPath,status);
   }
   
   strcpy(fullpath, tmpPath);
      
   return (*status);
}